

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkpoint_manager.cpp
# Opt level: O2

void __thiscall
duckdb::CheckpointReader::ReadTable
          (CheckpointReader *this,CatalogTransaction transaction,Deserializer *deserializer)

{
  Catalog *pCVar1;
  CatalogTransaction transaction_00;
  CatalogTransaction transaction_01;
  pointer pCVar2;
  SchemaCatalogEntry *schema;
  pointer pBVar3;
  create_info_set_t *pcVar4;
  type pBVar5;
  __node_base *p_Var6;
  unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
  bound_info;
  _Head_base<0UL,_duckdb::CreateInfo_*,_false> local_c8;
  undefined1 local_c0 [16];
  ClientContext *pCStack_b0;
  __node_base local_a8;
  _Elt_pointer prStack_a0;
  _Elt_pointer local_98;
  DatabaseInstance *local_88;
  ClientContext *pCStack_80;
  Transaction *local_78;
  __node_base _Stack_70;
  _Map_pointer local_68;
  DatabaseInstance *local_58;
  ClientContext *pCStack_50;
  Transaction *local_48;
  _Elt_pointer prStack_40;
  __node_base local_38;
  
  Deserializer::
  ReadProperty<duckdb::unique_ptr<duckdb::CreateInfo,std::default_delete<duckdb::CreateInfo>,true>>
            ((Deserializer *)local_c0,(field_id_t)deserializer,(char *)0x64);
  pCVar1 = this->catalog;
  local_38._M_nxt = (_Hash_node_base *)transaction.start_time;
  local_48 = transaction.transaction.ptr;
  prStack_40 = (_Elt_pointer)transaction.transaction_id;
  local_58 = transaction.db.ptr;
  pCStack_50 = transaction.context.ptr;
  pCVar2 = unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::operator->
                     ((unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>
                       *)local_c0);
  transaction_00.context.ptr._0_4_ = (int)pCStack_50;
  transaction_00.db.ptr = local_58;
  transaction_00.context.ptr._4_4_ = (int)((ulong)pCStack_50 >> 0x20);
  transaction_00.transaction.ptr._0_4_ = (int)local_48;
  transaction_00.transaction.ptr._4_4_ = (int)((ulong)local_48 >> 0x20);
  transaction_00.transaction_id._0_4_ = (int)prStack_40;
  transaction_00.transaction_id._4_4_ = (int)((ulong)prStack_40 >> 0x20);
  transaction_00.start_time = (transaction_t)local_38._M_nxt;
  schema = Catalog::GetSchema(pCVar1,transaction_00,&pCVar2->schema);
  local_c8._M_head_impl = (CreateInfo *)local_c0._0_8_;
  local_c0._0_8_ = (ClientContext *)0x0;
  Binder::BindCreateTableCheckpoint
            ((Binder *)&bound_info,
             (unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> *)
             &local_c8,schema);
  if (local_c8._M_head_impl != (CreateInfo *)0x0) {
    (*((local_c8._M_head_impl)->super_ParseInfo)._vptr_ParseInfo[1])();
  }
  local_c8._M_head_impl = (CreateInfo *)0x0;
  pBVar3 = unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
           ::operator->(&bound_info);
  pCVar2 = unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::operator->
                     (&pBVar3->base);
  pcVar4 = LogicalDependencyList::Set(&pCVar2->dependencies);
  p_Var6 = &(pcVar4->_M_h)._M_before_begin;
  while (p_Var6 = p_Var6->_M_nxt, p_Var6 != (__node_base *)0x0) {
    pBVar3 = unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
             ::operator->(&bound_info);
    LogicalDependencyList::AddDependency(&pBVar3->dependencies,(LogicalDependency *)(p_Var6 + 1));
  }
  local_68 = (_Map_pointer)transaction.start_time;
  local_78 = transaction.transaction.ptr;
  _Stack_70._M_nxt = (_Hash_node_base *)transaction.transaction_id;
  local_88 = transaction.db.ptr;
  pCStack_80 = transaction.context.ptr;
  pBVar5 = unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
           ::operator*(&bound_info);
  (*this->_vptr_CheckpointReader[0xc])(this,deserializer,pBVar5);
  pCVar1 = this->catalog;
  local_98 = (_Elt_pointer)transaction.start_time;
  local_a8._M_nxt = (_Hash_node_base *)transaction.transaction.ptr;
  prStack_a0 = (_Elt_pointer)transaction.transaction_id;
  local_c0._8_8_ = transaction.db.ptr;
  pCStack_b0 = transaction.context.ptr;
  pBVar5 = unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
           ::operator*(&bound_info);
  transaction_01.context.ptr._0_4_ = (int)pCStack_b0;
  transaction_01.db.ptr = (DatabaseInstance *)local_c0._8_8_;
  transaction_01.context.ptr._4_4_ = (int)((ulong)pCStack_b0 >> 0x20);
  transaction_01.transaction.ptr._0_4_ = (int)local_a8._M_nxt;
  transaction_01.transaction.ptr._4_4_ = (int)((ulong)local_a8._M_nxt >> 0x20);
  transaction_01.transaction_id._0_4_ = (int)prStack_a0;
  transaction_01.transaction_id._4_4_ = (int)((ulong)prStack_a0 >> 0x20);
  transaction_01.start_time = (transaction_t)local_98;
  Catalog::CreateTable(pCVar1,transaction_01,pBVar5);
  ::std::
  unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>_>::
  ~unique_ptr(&bound_info.
               super_unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>_>
             );
  if ((ClientContext *)local_c0._0_8_ != (ClientContext *)0x0) {
    (*(code *)(((((enable_shared_from_this<duckdb::ClientContext> *)local_c0._0_8_)->__weak_this_).
                internal.super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
              super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
              ();
  }
  return;
}

Assistant:

void CheckpointReader::ReadTable(CatalogTransaction transaction, Deserializer &deserializer) {
	// deserialize the table meta data
	auto info = deserializer.ReadProperty<unique_ptr<CreateInfo>>(100, "table");
	auto &schema = catalog.GetSchema(transaction, info->schema);
	auto bound_info = Binder::BindCreateTableCheckpoint(std::move(info), schema);

	for (auto &dep : bound_info->Base().dependencies.Set()) {
		bound_info->dependencies.AddDependency(dep);
	}

	// now read the actual table data and place it into the CreateTableInfo
	ReadTableData(transaction, deserializer, *bound_info);

	// finally create the table in the catalog
	catalog.CreateTable(transaction, *bound_info);
}